

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

uint64_t buffer_bookmark_pop(buffer_t *buffer,int width,int height,int *error)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = buffer->bookmarks_head;
  if (-1 < (long)iVar1) {
    buffer->bookmarks_head = iVar1 + -1;
    uVar2 = buffer->bookmarks[iVar1];
    *error = 0;
    uVar4 = uVar2 / (ulong)(long)width - ((ulong)(long)(height + -2) >> 1);
    if ((long)uVar4 < 1) {
      uVar4 = 0;
    }
    uVar3 = (buffer->size / (ulong)(long)width - (long)height) + 3;
    if (uVar4 < uVar3) {
      uVar3 = uVar4;
    }
    uVar4 = buffer->size - 1;
    if (uVar2 <= uVar4) {
      uVar4 = uVar2;
    }
    buffer->cursor = uVar4;
    return uVar3;
  }
  *error = 1;
  return 0;
}

Assistant:

uint64_t
buffer_bookmark_pop(buffer_t *buffer, int width, int height, int *error)
{
    if (buffer->bookmarks_head >= 0) {
        uintptr_t address = buffer->bookmarks[buffer->bookmarks_head--];
        *error = 0;
        return buffer_scroll(buffer, address, width, height);
    }

    *error = 1;
    return 0;
}